

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_assignment_helper
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_move)

{
  int *piVar1;
  e_req eVar2;
  char *pcVar3;
  bool bVar4;
  bool move;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  t_cpp_generator *this_00;
  pointer pptVar7;
  string tmp_name;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,"other",(allocator *)&local_d0);
  t_generator::tmp(&local_90,(t_generator *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  poVar6 = t_generator::indent((t_generator *)this,out);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar5));
  pcVar3 = " & ";
  poVar6 = std::operator<<(poVar6,"& ");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar5));
  std::operator<<(poVar6,"::operator=(");
  if (is_move) {
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(out,(string *)CONCAT44(extraout_var_01,iVar5));
    pcVar3 = " && ";
  }
  else {
    poVar6 = std::operator<<(out,"const ");
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_02,iVar5));
  }
  std::operator<<(poVar6,pcVar3 + 1);
  this_00 = (t_cpp_generator *)std::operator<<(out,(string *)&local_90);
  std::operator<<((ostream *)this_00,") ");
  if (!is_move) {
    bVar4 = is_struct_storage_not_throwing(this_00,tstruct);
    if (!bVar4) goto LAB_0017237e;
  }
  std::operator<<(out,"noexcept ");
LAB_0017237e:
  poVar6 = std::operator<<(out,"{");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"(void) ");
    poVar6 = std::operator<<(poVar6,(string *)&local_90);
    poVar6 = std::operator<<(poVar6,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  bVar4 = false;
  for (; pptVar7 !=
         (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    eVar2 = (*pptVar7)->req_;
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,(string *)&(*pptVar7)->name_);
    poVar6 = std::operator<<(poVar6," = ");
    std::operator+(&local_50,&local_90,".");
    std::operator+(&local_b0,&local_50,&(*pptVar7)->name_);
    if (is_move) {
      move = is_complex_type(this,(*pptVar7)->type_);
    }
    else {
      move = false;
    }
    anon_unknown.dwarf_d103f::maybeMove(&local_d0,&local_b0,move);
    poVar6 = std::operator<<(poVar6,(string *)&local_d0);
    poVar6 = std::operator<<(poVar6,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    bVar4 = (bool)(bVar4 | eVar2 != T_REQUIRED);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar4) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"__isset = ");
    std::operator+(&local_b0,&local_90,".__isset");
    std::__cxx11::string::string((string *)&local_d0,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,(string *)&local_d0);
    poVar6 = std::operator<<(poVar6,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"return *this;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void t_cpp_generator::generate_assignment_helper(ostream& out, t_struct* tstruct, bool is_move) {
  std::string tmp_name = tmp("other");

  indent(out) << tstruct->get_name() << "& " << tstruct->get_name() << "::operator=(";

  if (is_move) {
    out << tstruct->get_name() << "&& ";
  } else {
    out << "const " << tstruct->get_name() << "& ";
  }
  out << tmp_name << ") ";
  if(is_move || is_struct_storage_not_throwing(tstruct))
    out << "noexcept ";
  out << "{" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();

  // eliminate compiler unused warning
  if (members.empty())
    indent(out) << "(void) " << tmp_name << ";" << endl;

  vector<t_field*>::const_iterator f_iter;
  bool has_nonrequired_fields = false;
  for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {
    if ((*f_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
    indent(out) << (*f_iter)->get_name() << " = "
                << maybeMove(
                    tmp_name + "." + (*f_iter)->get_name(), 
                    is_move && is_complex_type((*f_iter)->get_type()))
                << ";" << endl;
  }
  if (has_nonrequired_fields) {
    indent(out) << "__isset = " << maybeMove(tmp_name + ".__isset", false) << ";" << endl;
  }

  indent(out) << "return *this;" << endl;
  indent_down();
  indent(out) << "}" << endl;
}